

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall
kratos::SystemVerilogCodeGen::generate_port_interface
          (SystemVerilogCodeGen *this,InstantiationStmt *stmt)

{
  initializer_list<kratos::IRNode_*> __l;
  bool bVar1;
  char cVar2;
  uint32_t uVar3;
  int iVar4;
  uint uVar5;
  map<kratos::Port_*,_kratos::Var_*,_std::less<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_kratos::Var_*>_>_>
  *pmVar6;
  ostream *poVar7;
  size_type __n;
  reference __args;
  iterator iVar8;
  iterator iVar9;
  map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
  *pmVar10;
  size_type sVar11;
  mapped_type *ppSVar12;
  InternalException *this_00;
  element_type *this_01;
  string *psVar13;
  __shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var14;
  element_type *peVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  element_type *this_02;
  mapped_type *__lhs;
  StmtException *this_03;
  reference __in;
  type *ptVar16;
  type *ptVar17;
  basic_ostream<char,_std::char_traits<char>_> *pbVar18;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  basic_string_view<char> bVar19;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_bool>
  pVar20;
  string_view sVar21;
  format_args args;
  format_args args_00;
  bool local_571;
  type *external_name_1;
  type *internal_name_1;
  ulong local_4f0;
  uint64_t i_1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_4a8;
  undefined1 local_4a0;
  int local_498;
  undefined1 local_492;
  allocator<kratos::IRNode_*> local_491;
  type local_490;
  type local_488;
  type *local_480;
  size_type local_478;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_470;
  remove_reference_t<std::__cxx11::basic_string<char>_> local_458;
  char local_438 [32];
  _Rb_tree_node_base local_418;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_3f8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_3f0;
  string local_3e8 [32];
  undefined1 local_3c8 [8];
  shared_ptr<kratos::InterfaceRef> i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> potential_name;
  undefined1 local_378 [8];
  string mod_port_name;
  InterfaceRef *internal_def;
  string local_348;
  undefined1 local_328 [8];
  shared_ptr<kratos::InterfacePort> internal_interface;
  string local_2f8 [32];
  undefined1 local_2d8 [8];
  string external_name;
  string internal_name;
  _Self local_290;
  type local_288;
  _Self local_280;
  _Base_ptr local_278;
  type *external;
  type *internal;
  __normal_iterator<std::pair<kratos::Port_*,_kratos::Var_*>_*,_std::vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>_>
  local_260;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
  *__range1_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  connections;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  interface_names;
  map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
  debug_info;
  pair<kratos::Port_*const,_kratos::Var_*> *iter;
  const_iterator __end1;
  const_iterator __begin1;
  map<kratos::Port_*,_kratos::Var_*,_std::less<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_kratos::Var_*>_>_>
  *__range1;
  map<kratos::Port_*,_kratos::Var_*,_std::less<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_kratos::Var_*>_>_>
  *mapping;
  vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
  ports;
  InstantiationStmt *stmt_local;
  SystemVerilogCodeGen *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_130;
  basic_string_view<char> local_128;
  _Rb_tree_node_base local_118;
  _Rb_tree_node_base *local_f0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  __node_base local_e0;
  __node_base local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_d0;
  undefined1 local_c8 [24];
  _Base_ptr local_b0;
  _Rb_tree_node_base local_a8;
  _Rb_tree_node_base *local_80;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char (*local_70) [55];
  char *local_68;
  _Rb_tree_node_base *local_60;
  _Rb_tree_node_base *local_58;
  _Base_ptr local_50;
  _Rb_tree_node_base *local_48;
  _Base_ptr local_40;
  _Rb_tree_node_base *local_38;
  _Base_ptr local_30;
  _Rb_tree_node_base *local_28;
  _Rb_tree_node_base *local_20;
  _Base_ptr local_18;
  _Rb_tree_node_base *local_10;
  
  ports.
  super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)stmt;
  pmVar6 = InstantiationStmt::port_mapping(stmt);
  bVar1 = std::
          map<kratos::Port_*,_kratos::Var_*,_std::less<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_kratos::Var_*>_>_>
          ::empty(pmVar6);
  if (bVar1) {
    poVar7 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,"();");
    cVar2 = Stream::endl(&this->stream_);
    std::operator<<(poVar7,cVar2);
  }
  else {
    poVar7 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10," (");
    cVar2 = Stream::endl(&this->stream_);
    std::operator<<(poVar7,cVar2);
    this->indent_ = this->indent_ + 1;
    std::
    vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
    ::vector((vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
              *)&mapping);
    pmVar6 = InstantiationStmt::port_mapping
                       ((InstantiationStmt *)
                        ports.
                        super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __n = std::
          map<kratos::Port_*,_kratos::Var_*,_std::less<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_kratos::Var_*>_>_>
          ::size(pmVar6);
    std::
    vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
    ::reserve((vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
               *)&mapping,__n);
    __end1 = std::
             map<kratos::Port_*,_kratos::Var_*,_std::less<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_kratos::Var_*>_>_>
             ::begin(pmVar6);
    iter = (pair<kratos::Port_*const,_kratos::Var_*> *)
           std::
           map<kratos::Port_*,_kratos::Var_*,_std::less<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_kratos::Var_*>_>_>
           ::end(pmVar6);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&iter), bVar1) {
      __args = std::_Rb_tree_const_iterator<std::pair<kratos::Port_*const,_kratos::Var_*>_>::
               operator*(&__end1);
      std::
      vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>
      ::emplace_back<std::pair<kratos::Port*const,kratos::Var*>const&>
                ((vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>
                  *)&mapping,__args);
      std::_Rb_tree_const_iterator<std::pair<kratos::Port_*const,_kratos::Var_*>_>::operator++
                (&__end1);
    }
    iVar8 = std::
            vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
            ::begin((vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                     *)&mapping);
    iVar9 = std::
            vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
            ::end((vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                   *)&mapping);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<kratos::Port*,kratos::Var*>*,std::vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>>,kratos::SystemVerilogCodeGen::generate_port_interface(kratos::InstantiationStmt*)::__0>
              (iVar8._M_current,iVar9._M_current);
    iVar8 = std::
            vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
            ::begin((vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                     *)&mapping);
    iVar9 = std::
            vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
            ::end((vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                   *)&mapping);
    std::
    stable_sort<__gnu_cxx::__normal_iterator<std::pair<kratos::Port*,kratos::Var*>*,std::vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>>,kratos::SystemVerilogCodeGen::generate_port_interface(kratos::InstantiationStmt*)::__1>
              (iVar8._M_current,iVar9._M_current);
    pmVar10 = InstantiationStmt::port_debug
                        ((InstantiationStmt *)
                         ports.
                         super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
    ::map((map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
           *)&interface_names._M_h._M_single_bucket,pmVar10);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&connections.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&__range1_1);
    sVar11 = std::
             vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
             ::size((vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                     *)&mapping);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::reserve((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&__range1_1,sVar11);
    __end1_1 = std::
               vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
               ::begin((vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                        *)&mapping);
    local_260._M_current =
         (pair<kratos::Port_*,_kratos::Var_*> *)
         std::
         vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
         ::end((vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                *)&mapping);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end1_1,&local_260);
      if (!bVar1) break;
      internal = &__gnu_cxx::
                  __normal_iterator<std::pair<kratos::Port_*,_kratos::Var_*>_*,_std::vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>_>
                  ::operator*(&__end1_1)->first;
      external = (type *)std::get<0ul,kratos::Port*,kratos::Var*>
                                   ((pair<kratos::Port_*,_kratos::Var_*> *)internal);
      local_278 = (_Base_ptr)
                  std::get<1ul,kratos::Port*,kratos::Var*>
                            ((pair<kratos::Port_*,_kratos::Var_*> *)internal);
      local_571 = false;
      if ((this->generator_->debug & 1U) != 0) {
        local_288 = *external;
        local_280._M_node =
             (_Base_ptr)
             std::
             map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
             ::find((map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
                     *)&interface_names._M_h._M_single_bucket,&local_288);
        local_290._M_node =
             (_Base_ptr)
             std::
             map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
             ::end((map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
                    *)&interface_names._M_h._M_single_bucket);
        local_571 = std::operator!=(&local_280,&local_290);
      }
      if (local_571 != false) {
        uVar3 = Stream::line_no(&this->stream_);
        internal_name.field_2._8_8_ = *external;
        ppSVar12 = std::
                   map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
                   ::at((map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
                         *)&interface_names._M_h._M_single_bucket,
                        (key_type *)((long)&internal_name.field_2 + 8));
        ((*ppSVar12)->super_IRNode).verilog_ln = uVar3;
      }
      std::__cxx11::string::string((string *)(external_name.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_2d8);
      iVar4 = (*(code *)((ports.
                          super__Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->first->super_Var).
                        super_IRNode._vptr_IRNode)();
      if (iVar4 == 1) {
        std::__cxx11::string::operator=
                  ((string *)(external_name.field_2._M_local_buf + 8),(string *)&(*external)->name);
        std::__cxx11::string::operator=((string *)local_2d8,(string *)&(*(type *)local_278)->name);
LAB_00961117:
        std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&i_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&external_name.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)&__range1_1,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&i_1);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&i_1);
        local_498 = 0;
      }
      else {
        uVar5 = (*((*external)->super_IRNode)._vptr_IRNode[0x1d])();
        if ((uVar5 & 1) == 0) {
          (*((*external)->super_IRNode)._vptr_IRNode[0x1f])(local_2f8);
          std::__cxx11::string::operator=
                    ((string *)(external_name.field_2._M_local_buf + 8),local_2f8);
          std::__cxx11::string::~string(local_2f8);
          (*((*(type *)local_278)->super_IRNode)._vptr_IRNode[0x1f])
                    (&internal_interface.
                      super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::operator=
                    ((string *)local_2d8,
                     (string *)
                     &internal_interface.
                      super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::~string
                    ((string *)
                     &internal_interface.
                      super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          goto LAB_00961117;
        }
        Var::as<kratos::InterfacePort>((Var *)local_328);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_328);
        if (!bVar1) {
          internal_def._6_1_ = 1;
          this_00 = (InternalException *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_348,"Unable to cast port",
                     (allocator<char> *)((long)&internal_def + 7));
          InternalException::InternalException(this_00,&local_348);
          internal_def._6_1_ = 0;
          __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
        }
        this_01 = std::
                  __shared_ptr_access<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_328);
        mod_port_name.field_2._8_8_ = InterfacePort::interface(this_01);
        psVar13 = InterfaceRef::name_abi_cxx11_((InterfaceRef *)mod_port_name.field_2._8_8_);
        std::__cxx11::string::operator=
                  ((string *)(external_name.field_2._M_local_buf + 8),(string *)psVar13);
        p_Var14 = (__shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)InterfaceRef::definition((InterfaceRef *)mod_port_name.field_2._8_8_);
        peVar15 = std::
                  __shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var14);
        uVar5 = (*peVar15->_vptr_IDefinition[8])();
        if ((uVar5 & 1) == 0) {
          (*((*(type *)local_278)->super_IRNode)._vptr_IRNode[0x27])(local_3e8);
          std::__cxx11::string::operator=((string *)local_2d8,local_3e8);
          std::__cxx11::string::~string(local_3e8);
        }
        else {
          p_Var14 = (__shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)InterfaceRef::definition((InterfaceRef *)mod_port_name.field_2._8_8_);
          peVar15 = std::
                    __shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var14);
          iVar4 = (*peVar15->_vptr_IDefinition[6])();
          std::__cxx11::string::string((string *)local_378,(string *)CONCAT44(extraout_var,iVar4));
          (*((*(type *)local_278)->super_IRNode)._vptr_IRNode[0x27])
                    ((undefined1 *)((long)&potential_name.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)local_2d8,(string *)(potential_name.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(potential_name.field_2._M_local_buf + 8));
          local_d0 = &i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
          local_d8._M_nxt = (_Hash_node_base *)0xb3a69d;
          vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_378;
          local_e0._M_nxt = (_Hash_node_base *)local_2d8;
          fmt::v7::make_args_checked<std::__cxx11::string&,std::__cxx11::string&,char[8],char>
                    ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_118,(v7 *)0xb3a69d,(char (*) [8])local_2d8,
                     (remove_reference_t<std::__cxx11::basic_string<char>_&> *)vargs,
                     (remove_reference_t<std::__cxx11::basic_string<char>_&> *)in_R8.values_);
          local_f0 = &local_118;
          bVar19 = fmt::v7::to_string_view<char,_0>((char *)local_d8._M_nxt);
          local_40 = (_Base_ptr)&this_local;
          local_48 = local_f0;
          local_38 = local_f0;
          local_28 = local_f0;
          local_30 = local_40;
          local_128 = bVar19;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_40,0xdd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_f0);
          format_str.size_ = (size_t)this_local;
          format_str.data_ = (char *)local_128.size_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_130.values_;
          in_R8 = local_130;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)
                     &i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(detail *)local_128.data_,format_str,args);
          iVar4 = (*((*(type *)local_278)->super_IRNode)._vptr_IRNode[0xd])();
          Generator::get_interface((Generator *)local_3c8,(string *)CONCAT44(extraout_var_00,iVar4))
          ;
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_3c8);
          if (bVar1) {
            this_02 = std::
                      __shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_3c8);
            p_Var14 = (__shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)InterfaceRef::definition(this_02);
            peVar15 = std::
                      __shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(p_Var14);
            uVar5 = (*peVar15->_vptr_IDefinition[8])();
            if ((uVar5 & 1) == 0) {
              std::__cxx11::string::operator=
                        ((string *)local_2d8,
                         (string *)
                         &i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
          }
          std::shared_ptr<kratos::InterfaceRef>::~shared_ptr
                    ((shared_ptr<kratos::InterfaceRef> *)local_3c8);
          std::__cxx11::string::~string
                    ((string *)
                     &i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::~string((string *)local_378);
        }
        local_3f0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&connections.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (key_type *)((long)&external_name.field_2 + 8));
        local_3f8._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&connections.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar1 = std::__detail::operator!=(&local_3f0,&local_3f8);
        if (bVar1) {
          __lhs = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&connections.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (key_type *)((long)&external_name.field_2 + 8));
          bVar1 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_2d8);
          if (bVar1) {
            local_492 = 1;
            this_03 = (StmtException *)__cxa_allocate_exception(0x10);
            (*((*external)->super_IRNode)._vptr_IRNode[0x20])(local_438);
            (*((*(type *)local_278)->super_IRNode)._vptr_IRNode[0x20])(&local_458);
            local_60 = &local_418;
            local_68 = "{0} and {1} are not from the same interface definition";
            local_70 = (char (*) [55])local_438;
            vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_458;
            fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string,char[55],char>
                      ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a8,(v7 *)"{0} and {1} are not from the same interface definition",
                       local_70,(remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs_1,
                       (remove_reference_t<std::__cxx11::basic_string<char>_> *)in_R8.values_);
            local_80 = &local_a8;
            join_0x00000010_0x00000000_ = fmt::v7::to_string_view<char,_0>(local_68);
            local_50 = (_Base_ptr)local_c8;
            local_58 = local_80;
            local_20 = local_80;
            local_10 = local_80;
            local_18 = local_50;
            fmt::v7::
            basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                 *)local_50,0xdd,
                                (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                 *)local_80);
            format_str_00.size_ = local_c8._0_8_;
            format_str_00.data_ = (char *)local_b0;
            args_00.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ = in_R9.values_;
            args_00.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = local_c8._8_8_;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)&local_418,(detail *)local_c8._16_8_,format_str_00,args_00);
            local_490 = *external;
            local_488 = *(type *)local_278;
            local_480 = &local_490;
            local_478 = 2;
            std::allocator<kratos::IRNode_*>::allocator(&local_491);
            __l._M_len = local_478;
            __l._M_array = (iterator)local_480;
            std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                      (&local_470,__l,&local_491);
            StmtException::StmtException(this_03,(string *)&local_418,&local_470);
            local_492 = 0;
            __cxa_throw(this_03,&StmtException::typeinfo,StmtException::~StmtException);
          }
          local_498 = 5;
        }
        else {
          pVar20 = std::
                   unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   ::emplace<std::__cxx11::string&,std::__cxx11::string&>
                             ((unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                               *)&connections.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&external_name.field_2 + 8),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2d8);
          local_4a8._M_cur =
               (__node_type *)
               pVar20.first.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ._M_cur;
          local_4a0 = pVar20.second;
          local_498 = 0;
        }
        std::shared_ptr<kratos::InterfacePort>::~shared_ptr
                  ((shared_ptr<kratos::InterfacePort> *)local_328);
        if (local_498 == 0) goto LAB_00961117;
      }
      std::__cxx11::string::~string((string *)local_2d8);
      std::__cxx11::string::~string((string *)(external_name.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<std::pair<kratos::Port_*,_kratos::Var_*>_*,_std::vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>_>
      ::operator++(&__end1_1);
    }
    local_4f0 = 0;
    while( true ) {
      sVar11 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&__range1_1);
      if (sVar11 <= local_4f0) break;
      __in = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&__range1_1,local_4f0);
      ptVar16 = std::get<0ul,std::__cxx11::string,std::__cxx11::string>(__in);
      ptVar17 = std::get<1ul,std::__cxx11::string,std::__cxx11::string>(__in);
      sVar21 = indent(this);
      pbVar18 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                                &(this->stream_).super_stringstream.field_0x10,sVar21);
      poVar7 = std::operator<<(pbVar18,".");
      poVar7 = std::operator<<(poVar7,(string *)ptVar16);
      poVar7 = std::operator<<(poVar7,"(");
      poVar7 = std::operator<<(poVar7,(string *)ptVar17);
      std::operator<<(poVar7,")");
      sVar11 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&__range1_1);
      if (local_4f0 == sVar11 - 1) {
        cVar2 = Stream::endl(&this->stream_);
        std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,cVar2);
      }
      else {
        poVar7 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,",");
        cVar2 = Stream::endl(&this->stream_);
        std::operator<<(poVar7,cVar2);
      }
      local_4f0 = local_4f0 + 1;
    }
    sVar21 = pre_indent(this);
    pbVar18 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                              &(this->stream_).super_stringstream.field_0x10,sVar21);
    poVar7 = std::operator<<(pbVar18,");");
    cVar2 = Stream::endl(&this->stream_);
    poVar7 = std::operator<<(poVar7,cVar2);
    cVar2 = Stream::endl(&this->stream_);
    std::operator<<(poVar7,cVar2);
    this->indent_ = this->indent_ - 1;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&__range1_1);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&connections.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
    ::~map((map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
            *)&interface_names._M_h._M_single_bucket);
    std::
    vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
    ::~vector((vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
               *)&mapping);
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::generate_port_interface(kratos::InstantiationStmt* stmt) {
    if (stmt->port_mapping().empty()) {
        stream_ << "();" << stream_.endl();
        return;
    }
    stream_ << " (" << stream_.endl();
    indent_++;
    std::vector<std::pair<Port*, Var*>> ports;
    auto const& mapping = stmt->port_mapping();
    ports.reserve(mapping.size());
    for (auto const& iter : mapping) ports.emplace_back(iter);
    std::sort(ports.begin(), ports.end(),
              [](const auto& lhs, const auto& rhs) { return lhs.first->name < rhs.first->name; });
    // sort again based on the input and output
    // use stable sort to preserve the previous order
    std::stable_sort(ports.begin(), ports.end(), [](const auto& lhs, const auto& rhs) {
        return lhs.first->port_direction() == PortDirection::In &&
               rhs.first->port_direction() == PortDirection::Out;
    });

    auto debug_info = stmt->port_debug();
    std::unordered_map<std::string, std::string> interface_names;
    std::vector<std::pair<std::string, std::string>> connections;
    connections.reserve(ports.size());
    for (auto const& [internal, external] : ports) {
        if (generator_->debug && debug_info.find(internal) != debug_info.end()) {
            debug_info.at(internal)->verilog_ln = stream_.line_no();
        }
        std::string internal_name;
        std::string external_name;
        if (stmt->instantiation_type() == InstantiationStmt::InstantiationType::Interface) {
            internal_name = internal->name;
            external_name = external->name;
        } else {
            // module
            if (!internal->is_interface()) {
                internal_name = internal->to_string();
                external_name = external->to_string();
            } else {
                // we assume the interface connectivity has been checked
                // internal has to be an interface
                auto internal_interface = internal->as<InterfacePort>();
                if (!internal_interface) throw InternalException("Unable to cast port");
                const auto* internal_def = internal_interface->interface();
                internal_name = internal_def->name();
                if (internal_def->definition()->is_modport()) {
                    // it's a mod port
                    // get the mod port name
                    auto mod_port_name = internal_def->definition()->name();
                    external_name = external->base_name();
                    // FIXME: this is a little bit hacky here
                    auto potential_name = ::format("{0}.{1}", external_name, mod_port_name);
                    auto i = external->generator()->get_interface(external_name);
                    if (i && !i->definition()->is_modport()) {
                        external_name = potential_name;
                    }
                } else {
                    external_name = external->base_name();
                }

                if (interface_names.find(internal_name) != interface_names.end()) {
                    if (interface_names.at(internal_name) != external_name) {
                        throw StmtException(
                            ::format("{0} and {1} are not from the same interface definition",
                                     internal->handle_name(), external->handle_name()),
                            {internal, external});
                    }
                    continue;
                }
                interface_names.emplace(internal_name, external_name);
            }
        }
        connections.emplace_back(std::make_pair(internal_name, external_name));
    }
    for (uint64_t i = 0; i < connections.size(); i++) {
        auto const& [internal_name, external_name] = connections[i];
        stream_ << indent() << "." << internal_name << "(" << external_name << ")";
        if (i != connections.size() - 1)
            stream_ << "," << stream_.endl();
        else
            stream_ << stream_.endl();
    }
    stream_ << pre_indent() << ");" << stream_.endl() << stream_.endl();
    indent_--;
}